

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::VerifyMarkBigBlockList(Recycler *this,BigBlock *memoryBlocks)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  for (; memoryBlocks != (BigBlock *)0x0;
      memoryBlocks = (memoryBlocks->super_ArenaMemoryBlock).field_0.nextBigBlock) {
    uVar1 = memoryBlocks->currentByte;
    for (uVar2 = 0; uVar1 >> 3 != uVar2; uVar2 = uVar2 + 1) {
      VerifyMark(this,(&memoryBlocks[1].super_ArenaMemoryBlock.field_0)[uVar2].next);
    }
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkBigBlockList(BigBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    BigBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base=(void**)blockp->GetBytes();
        size_t slotCount = blockp->currentByte / sizeof(void*);
        scanRootBytes +=  blockp->currentByte;
        for (size_t i=0; i < slotCount; i++)
        {
            VerifyMark(base[i]);
        }
        blockp = blockp->nextBigBlock;
    }
}